

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImGuiStoragePair *pIVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char *pcVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  ImGuiColumns *pIVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  float fVar23;
  ImVec2 local_38;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar9 = window->WasActive;
    pIVar5 = GImGui->NavWindow;
    if (bVar9 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar13 = " *Inactive*";
    }
    else {
      pcVar13 = "";
    }
    bVar7 = TreeNodeEx(label,(uint)(pIVar5 == window),"%s \'%s\'%s",label,window->Name,pcVar13);
    if (bVar9 == false) {
      PopStyleColor(1);
    }
    bVar8 = IsItemHovered(0);
    pcVar13 = extraout_RDX;
    if ((bVar8 & bVar9) == 1) {
      local_38.x = (window->Pos).x + (window->Size).x;
      local_38.y = (window->Pos).y + (window->Size).y;
      ImDrawList::AddRect(&GImGui->ForegroundDrawList,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0)
      ;
      pcVar13 = extraout_RDX_00;
    }
    if (bVar7) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
        pcVar13 = extraout_RDX_01;
      }
      uVar4 = window->Flags;
      NodeDrawList(window,window->DrawList,pcVar13);
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y);
      pcVar13 = "Child ";
      if ((uVar4 >> 0x18 & 1) == 0) {
        pcVar13 = "";
      }
      pcVar10 = "Tooltip ";
      if ((uVar4 >> 0x19 & 1) == 0) {
        pcVar10 = "";
      }
      pcVar11 = "Popup ";
      if ((uVar4 >> 0x1a & 1) == 0) {
        pcVar11 = "";
      }
      pcVar14 = "Modal ";
      if ((uVar4 >> 0x1b & 1) == 0) {
        pcVar14 = "";
      }
      pcVar15 = "ChildMenu ";
      if ((uVar4 >> 0x1c & 1) == 0) {
        pcVar15 = "";
      }
      pcVar16 = "NoSavedSettings ";
      if ((uVar4 >> 8 & 1) == 0) {
        pcVar16 = "";
      }
      pcVar21 = "NoMouseInputs";
      if ((uVar4 >> 9 & 1) == 0) {
        pcVar21 = "";
      }
      pcVar17 = "NoNavInputs";
      if ((uVar4 >> 0x12 & 1) == 0) {
        pcVar17 = "";
      }
      pcVar18 = "AlwaysAutoResize";
      if ((uVar4 & 0x40) == 0) {
        pcVar18 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar4,pcVar13,pcVar10,pcVar11,pcVar14
                 ,pcVar15,pcVar16,pcVar21,pcVar17,pcVar18);
      pcVar13 = "##X";
      if (window->ScrollbarX == false) {
        pcVar13 = " \t";
      }
      pcVar10 = "##Y";
      if (window->ScrollbarY == false) {
        pcVar10 = " \t";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,(double)(window->Scroll).y,
                 (double)(window->ScrollMax).y,pcVar13 + 2,pcVar10 + 2);
      if ((window->Active != false) || (uVar12 = 0xffffffff, window->WasActive != false)) {
        uVar12 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar12)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
                 (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar13 = "NULL";
      }
      else {
        pcVar13 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLastChildNavWindow: %s",pcVar13);
      fVar3 = window->NavRectRel[0].Min.x;
      pIVar1 = &window->NavRectRel[0].Max;
      if ((pIVar1->x <= fVar3 && fVar3 != pIVar1->x) ||
         (fVar23 = window->NavRectRel[0].Min.y, pfVar2 = &window->NavRectRel[0].Max.y,
         *pfVar2 <= fVar23 && fVar23 != *pfVar2)) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar3,
                   (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                   (double)window->NavRectRel[0].Max.y);
      }
      if (window->RootWindow != window) {
        NodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        NodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar9 = TreeNode("Columns","Columns sets (%d)");
        if (bVar9) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar22 = 0;
            do {
              pIVar19 = (window->ColumnsStorage).Data;
              bVar9 = TreeNode((void *)(ulong)pIVar19[lVar22].ID,
                               "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                               (void *)(ulong)pIVar19[lVar22].ID,(ulong)(uint)pIVar19[lVar22].Count,
                               (ulong)(uint)pIVar19[lVar22].Flags);
              if (bVar9) {
                pIVar19 = pIVar19 + lVar22;
                BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                           (double)(pIVar19->OffMaxX - pIVar19->OffMinX),(double)pIVar19->OffMinX,
                           (double)pIVar19->OffMaxX);
                if (0 < (pIVar19->Columns).Size) {
                  lVar20 = 0;
                  uVar12 = 0;
                  do {
                    fVar3 = *(float *)((long)&((pIVar19->Columns).Data)->OffsetNorm + lVar20);
                    fVar23 = GetColumnOffsetFromNorm(pIVar19,fVar3);
                    BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar3,
                               (double)fVar23,uVar12 & 0xffffffff);
                    uVar12 = uVar12 + 1;
                    lVar20 = lVar20 + 0x1c;
                  } while ((long)uVar12 < (long)(pIVar19->Columns).Size);
                }
                TreePop();
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      uVar4 = (window->StateStorage).Data.Size;
      bVar9 = TreeNode("Storage","%s: %d entries, %d bytes","Storage",(ulong)uVar4,
                       (ulong)(uVar4 << 4));
      if (bVar9) {
        if (0 < (window->StateStorage).Data.Size) {
          lVar20 = 8;
          lVar22 = 0;
          do {
            pIVar6 = (window->StateStorage).Data.Data;
            BulletText("Key 0x%08X Value { i: %d }",(ulong)*(uint *)((long)pIVar6 + lVar20 + -8),
                       (ulong)*(uint *)((long)&pIVar6->key + lVar20));
            lVar22 = lVar22 + 1;
            lVar20 = lVar20 + 0x10;
          } while (lVar22 < (window->StateStorage).Data.Size);
        }
        TreePop();
      }
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }

            ImGuiContext& g = *GImGui;
            const bool is_active = window->WasActive;
            ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            const bool open = ImGui::TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
            if (!is_active) { PopStyleColor(); }
            if (ImGui::IsItemHovered() && is_active)
                ImGui::GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }